

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialog::setOption(QColorDialog *this,ColorDialogOption option,bool on)

{
  ColorDialogOption CVar1;
  
  CVar1 = QColorDialogOptions::options();
  if (((CVar1 & option) == 0) != on) {
    return;
  }
  setOptions(this,(ColorDialogOptions)(CVar1 ^ option));
  return;
}

Assistant:

void QColorDialog::setOption(ColorDialogOption option, bool on)
{
    const QColorDialog::ColorDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}